

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::~SectionNode(SectionNode *this)

{
  ~SectionNode(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~SectionNode() = default;